

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanCastTests.cpp
# Opt level: O0

int testSpanCastTestsBasics(void)

{
  initializer_list<int> __l;
  size_t sVar1;
  ostream *poVar2;
  pointer ptVar3;
  pointer ptVar4;
  size_t sVar5;
  SpanSize<18446744073709551615UL> extraout_RDX;
  SpanSize<18446744073709551615UL> extraout_RDX_00;
  SpanSize<18446744073709551615UL> extraout_RDX_01;
  Span<const_int,_18446744073709551615UL> SVar6;
  Span<const_long,_18446744073709551615UL> SVar7;
  Span<const_int,_18446744073709551615UL> SVar8;
  Span<const_signed_char,_18446744073709551615UL> SVar9;
  undefined1 local_f8 [8];
  Span<const_int,_18446744073709551615UL> original_1;
  undefined1 auStack_d8 [8];
  Span<const_signed_char,_18446744073709551615UL> casted_1;
  undefined1 local_b0 [8];
  Span<const_int,_18446744073709551615UL> original;
  undefined1 auStack_80 [8];
  Span<const_long,_18446744073709551615UL> casted;
  Span<const_int,_18446744073709551615UL> span;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  SVar6 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  casted.m_size.m_size = (size_t)SVar6.m_ptr;
  SVar6.m_ptr = (pointer)SVar6.m_size.m_size;
  SVar7 = MILBlob::Util::SpanCast<long_const,int_const>((Util *)casted.m_size.m_size,SVar6);
  casted.m_ptr = (pointer)SVar7.m_size.m_size;
  auStack_80 = (undefined1  [8])SVar7.m_ptr;
  sVar1 = MILBlob::Util::Span<const_long,_18446744073709551615UL>::Size
                    ((Span<const_long,_18446744073709551615UL> *)auStack_80);
  if (sVar1 == 2) {
    casted_1.m_size.m_size = (size_t)auStack_80;
    SVar7.m_size.m_size = extraout_RDX.m_size;
    SVar7.m_ptr = casted.m_ptr;
    SVar8 = MILBlob::Util::SpanCast<int_const,long_const>((Util *)auStack_80,SVar7);
    original.m_ptr = (pointer)SVar8.m_size.m_size;
    local_b0 = (undefined1  [8])SVar8.m_ptr;
    ptVar3 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Data
                       ((Span<const_int,_18446744073709551615UL> *)&casted.m_size);
    ptVar4 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Data
                       ((Span<const_int,_18446744073709551615UL> *)local_b0);
    if (ptVar3 == ptVar4) {
      sVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Size
                        ((Span<const_int,_18446744073709551615UL> *)&casted.m_size);
      sVar5 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Size
                        ((Span<const_int,_18446744073709551615UL> *)local_b0);
      if (sVar1 == sVar5) {
        original_1.m_size.m_size = casted.m_size.m_size;
        SVar8.m_size.m_size = extraout_RDX_00.m_size;
        SVar8.m_ptr = (pointer)SVar6.m_size.m_size;
        SVar9 = MILBlob::Util::SpanCast<signed_char_const,int_const>
                          ((Util *)casted.m_size.m_size,SVar8);
        casted_1.m_ptr = (pointer)SVar9.m_size.m_size;
        auStack_d8 = (undefined1  [8])SVar9.m_ptr;
        sVar1 = MILBlob::Util::Span<const_signed_char,_18446744073709551615UL>::Size
                          ((Span<const_signed_char,_18446744073709551615UL> *)auStack_d8);
        if (sVar1 == 0x10) {
          SVar9.m_size.m_size = extraout_RDX_01.m_size;
          SVar9.m_ptr = casted_1.m_ptr;
          SVar6 = MILBlob::Util::SpanCast<int_const,signed_char_const>((Util *)auStack_d8,SVar9);
          original_1.m_ptr = (pointer)SVar6.m_size.m_size;
          local_f8 = (undefined1  [8])SVar6.m_ptr;
          ptVar3 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Data
                             ((Span<const_int,_18446744073709551615UL> *)&casted.m_size);
          ptVar4 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Data
                             ((Span<const_int,_18446744073709551615UL> *)local_f8);
          if (ptVar3 == ptVar4) {
            sVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Size
                              ((Span<const_int,_18446744073709551615UL> *)&casted.m_size);
            sVar5 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Size
                              ((Span<const_int,_18446744073709551615UL> *)local_f8);
            if (sVar1 == sVar5) {
              values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ = 0;
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanCastTests.cpp"
                                      );
              poVar2 = std::operator<<(poVar2,":");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21);
              poVar2 = std::operator<<(poVar2,": error: ");
              poVar2 = std::operator<<(poVar2,"(span.Size()) == (original.Size())");
              poVar2 = std::operator<<(poVar2," was false, expected true.");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ = 1;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanCastTests.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x20);
            poVar2 = std::operator<<(poVar2,": error: ");
            poVar2 = std::operator<<(poVar2,"(span.Data()) == (original.Data())");
            poVar2 = std::operator<<(poVar2," was false, expected true.");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ = 1;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanCastTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1d);
          poVar2 = std::operator<<(poVar2,": error: ");
          poVar2 = std::operator<<(poVar2,"(casted.Size()) == (size_t(16))");
          poVar2 = std::operator<<(poVar2," was false, expected true.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanCastTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x18);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"(span.Size()) == (original.Size())");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanCastTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x17);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(span.Data()) == (original.Data())");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanCastTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x14);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(casted.Size()) == (size_t(2))");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  original.m_size.m_size._4_4_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int testSpanCastTestsBasics()
{
    const std::vector<int32_t> values = {1, 2, 3, 4};
    Span<const int32_t> span = MakeSpan(values);

    {  // up cast
        Span<const int64_t> casted = SpanCast<const int64_t>(span);
        ML_ASSERT_EQ(casted.Size(), size_t(2));

        Span<const int32_t> original = SpanCast<const int32_t>(casted);
        ML_ASSERT_EQ(span.Data(), original.Data());
        ML_ASSERT_EQ(span.Size(), original.Size());
    }

    {  // down cast
        Span<const int8_t> casted = SpanCast<const int8_t>(span);
        ML_ASSERT_EQ(casted.Size(), size_t(16));

        Span<const int32_t> original = SpanCast<const int32_t>(casted);
        ML_ASSERT_EQ(span.Data(), original.Data());
        ML_ASSERT_EQ(span.Size(), original.Size());
    }

    return 0;
}